

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_logxor(LispPTR tosm1,LispPTR tos)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = (ulong)tos;
  uVar2 = (ulong)tosm1;
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    uVar6 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    uVar6 = tosm1 & 0xffff;
  }
  else {
    uVar3 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 3) {
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      if (*(float *)(Lisp_world + uVar2) != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      uVar6 = (uint)*(float *)(Lisp_world + uVar2);
    }
    else {
      if (uVar3 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((tosm1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      uVar6 = *(uint *)(Lisp_world + uVar2);
    }
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar5 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    uVar5 = tos & 0xffff;
  }
  else {
    uVar3 = *(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar3 == 3) {
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      if (*(float *)(Lisp_world + uVar1) != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      uVar5 = (uint)*(float *)(Lisp_world + uVar1);
    }
    else {
      if (uVar3 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
      }
      uVar5 = *(uint *)(Lisp_world + uVar1);
    }
  }
  uVar5 = uVar5 ^ uVar6;
  if ((uVar5 & 0xffff0000) == 0xffff0000) {
    uVar5 = uVar5 & 0xffff | 0xf0000;
  }
  else if ((uVar5 & 0xffff0000) == 0) {
    uVar5 = uVar5 | 0xe0000;
  }
  else {
    puVar4 = (uint *)createcell68k(2);
    *puVar4 = uVar5;
    if (((ulong)puVar4 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",puVar4);
    }
    uVar5 = (uint)((ulong)((long)puVar4 - (long)Lisp_world) >> 1);
  }
  return uVar5;
}

Assistant:

LispPTR N_OP_logxor(LispPTR tosm1, LispPTR tos) {
    int arg1, arg2;

    N_IGETNUMBER(tosm1, arg1, do_ufn);
    N_IGETNUMBER(tos, arg2, do_ufn);

    arg1 = arg1 ^ arg2;

    N_ARITH_SWITCH(arg1);

  do_ufn:
    ERROR_EXIT(tos);
}